

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O1

void EthBasePort::PrintFirewirePacket(ostream *out,quadlet_t *packet,uint max_quads)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  char *__s;
  long lVar4;
  long lVar5;
  char cVar6;
  ostream oVar7;
  uint uVar8;
  ostream *poVar9;
  ostream *poVar10;
  size_t sVar11;
  byte bVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong local_48;
  
  if (max_quads < 4) {
    std::__ostream_insert<char,std::char_traits<char>>
              (out,"PrintPacket: should print more than 4 quadlets (max_quads = ",0x3c);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
    lVar16 = *(long *)poVar9;
    goto LAB_00113654;
  }
  bVar2 = (byte)*packet;
  bVar12 = bVar2 >> 4;
  std::__ostream_insert<char,std::char_traits<char>>(out,"Firewire Packet:",0x10);
  cVar6 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar6);
  std::ostream::put(cVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"  dest: ",8);
  *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
       *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", node: ",8);
  *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
       *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,", tl: ",6);
  lVar16 = *(long *)poVar10;
  *(uint *)(poVar10 + *(long *)(lVar16 + -0x18) + 0x18) =
       *(uint *)(poVar10 + *(long *)(lVar16 + -0x18) + 0x18) & 0xffffffb5 | 8;
  *(undefined8 *)(poVar10 + *(long *)(lVar16 + -0x18) + 0x10) = 2;
  poVar9 = poVar10 + *(long *)(lVar16 + -0x18);
  if (poVar10[*(long *)(lVar16 + -0x18) + 0xe1] == (ostream)0x0) {
    oVar7 = (ostream)std::ios::widen((char)poVar9);
    poVar9[0xe0] = oVar7;
    poVar9[0xe1] = (ostream)0x1;
  }
  poVar9[0xe0] = (ostream)0x30;
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", rt: ",6);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", tcode: ",9);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," (",2);
  __s = PrintFirewirePacket::tcode_name[bVar12];
  sVar11 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,__s,sVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", pri: ",7);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"  src: ",7);
  *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
       *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", node: ",8);
  *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
       *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  if ((bVar2 & 0xe0) == 0x60) {
    std::__ostream_insert<char,std::char_traits<char>>(out,", rcode: ",9);
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::ostream::_M_insert<unsigned_long>((ulong)out);
  }
  else if ((((bVar2 & 0xb0) == 0x10) || (bVar2 < 0x10)) || (bVar12 == 4)) {
    std::__ostream_insert<char,std::char_traits<char>>(out,", dest_off: ",0xc);
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(out,"  dest_off: ",0xc);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar6);
  std::ostream::put(cVar6);
  std::ostream::flush();
  if ((bVar12 < 8) && ((0xa2U >> (uint)bVar12 & 1) != 0)) {
    uVar3 = packet[3];
    local_48 = (ulong)(uVar3 >> 0x10);
    std::__ostream_insert<char,std::char_traits<char>>(out,"  data_length: ",0xf);
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ext_tcode: ",0xd);
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    lVar16 = *(long *)poVar9;
    lVar4 = *(long *)(lVar16 + -0x18);
    *(uint *)(poVar9 + lVar4 + 0x18) = *(uint *)(poVar9 + lVar4 + 0x18) & 0xffffffb5 | 2;
    std::ios::widen((char)*(undefined8 *)(lVar16 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if ((uVar3 & 0x30000) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                (out,"WARNING: data_length is not a multiple of 4",0x2b);
      lVar16 = *(long *)out;
      poVar9 = out;
LAB_00113c00:
      std::ios::widen((char)*(undefined8 *)(lVar16 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
    }
  }
  else {
    local_48 = 0;
    if (bVar2 < 0x10 || bVar12 == 6) {
      std::__ostream_insert<char,std::char_traits<char>>(out,"  data: ",8);
      *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
           *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)out);
      lVar16 = *(long *)poVar9;
      *(uint *)(poVar9 + *(long *)(lVar16 + -0x18) + 0x18) =
           *(uint *)(poVar9 + *(long *)(lVar16 + -0x18) + 0x18) & 0xffffffb5 | 2;
      local_48 = 0;
      goto LAB_00113c00;
    }
  }
  if ((bVar12 == 4) || (max_quads != 4)) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"  header_crc: ",0xe);
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    lVar16 = *(long *)poVar9;
    lVar4 = *(long *)(lVar16 + -0x18);
    *(uint *)(poVar9 + lVar4 + 0x18) = *(uint *)(poVar9 + lVar4 + 0x18) & 0xffffffb5 | 2;
    std::ios::widen((char)*(undefined8 *)(lVar16 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if ((bVar12 == 7) || (bVar12 == 1)) {
      uVar3 = (uint)(local_48 >> 2);
      uVar13 = max_quads - 5;
      uVar8 = uVar13;
      if (uVar3 < uVar13) {
        uVar8 = uVar3;
      }
      if (uVar8 != 0) {
        lVar16 = 1;
        uVar15 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(out,"  data[",7);
          lVar4 = *(long *)out;
          lVar5 = *(long *)(lVar4 + -0x18);
          *(uint *)(out + lVar5 + 0x18) = *(uint *)(out + lVar5 + 0x18) & 0xffffffb5 | 2;
          lVar4 = *(long *)(lVar4 + -0x18);
          poVar9 = out + lVar4;
          if (out[lVar4 + 0xe1] == (ostream)0x0) {
            oVar7 = (ostream)std::ios::widen((char)poVar9);
            poVar9[0xe0] = oVar7;
            poVar9[0xe1] = (ostream)0x1;
          }
          poVar9[0xe0] = (ostream)0x20;
          *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 3;
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,":",1);
          *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 3;
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"]:  ",4);
          uVar14 = 0;
          do {
            lVar4 = *(long *)out;
            *(uint *)(out + *(long *)(lVar4 + -0x18) + 0x18) =
                 *(uint *)(out + *(long *)(lVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
            *(undefined8 *)(out + *(long *)(lVar4 + -0x18) + 0x10) = 8;
            poVar9 = out + *(long *)(lVar4 + -0x18);
            if (out[*(long *)(lVar4 + -0x18) + 0xe1] == (ostream)0x0) {
              oVar7 = (ostream)std::ios::widen((char)poVar9);
              poVar9[0xe0] = oVar7;
              poVar9[0xe1] = (ostream)0x1;
            }
            poVar9[0xe0] = (ostream)0x30;
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)out);
            *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
                 *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  ",2);
          } while ((uVar14 < 3) && (uVar1 = lVar16 + uVar14, uVar14 = uVar14 + 1, uVar1 < uVar8));
          std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar6);
          std::ostream::put(cVar6);
          std::ostream::flush();
          uVar15 = uVar15 + 4;
          lVar16 = lVar16 + 4;
        } while (uVar15 < uVar8);
      }
      if (3 < (uint)local_48 && uVar3 < uVar13) {
        std::__ostream_insert<char,std::char_traits<char>>(out,"  data_crc: ",0xc);
        *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
             *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)out);
        lVar16 = *(long *)poVar9;
        *(uint *)(poVar9 + *(long *)(lVar16 + -0x18) + 0x18) =
             *(uint *)(poVar9 + *(long *)(lVar16 + -0x18) + 0x18) & 0xffffffb5 | 2;
LAB_00113654:
        std::ios::widen((char)*(undefined8 *)(lVar16 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        return;
      }
    }
  }
  return;
}

Assistant:

void EthBasePort::PrintFirewirePacket(std::ostream &out, const quadlet_t *packet, unsigned int max_quads)
{
    static const char *tcode_name[16] = { "qwrite", "bwrite", "wresponse", "", "qread", "bread",
                                          "qresponse", "bresponse", "cycstart", "lockreq",
                                          "stream", "lockresp", "", "", "", "" };
    unsigned char tcode = (packet[0]&0x000000F0)>>4;
    unsigned int data_length = 0;
    // No point in printing anything if less than 4
    if (max_quads < 4) {
        out << "PrintPacket: should print more than 4 quadlets (max_quads = "
            << max_quads << ")" << std::endl;
        return;
    }
    out << "Firewire Packet:" << std::endl;
    out << "  dest: " << std::hex << ((packet[0]&0xffc00000)>>20)
        << ", node: " << std::dec << ((packet[0]&0x003f0000)>>16)
        << ", tl: " << std::hex << std::setw(2) << std::setfill('0') << ((packet[0]&0x0000fc00)>>10)
        << ", rt: " << ((packet[0]&0x00000300)>>8)
        << ", tcode: " << static_cast<unsigned int>(tcode) << " (" << tcode_name[tcode] << ")"
        << ", pri: " << (packet[0]&0x0000000F) << std::endl;
    out << "  src: " << std::hex << ((packet[1]&0xffc00000)>>20)
        << ", node: " << std::dec << ((packet[1]&0x003f0000)>>16);

    if ((tcode == QRESPONSE) || (tcode == BRESPONSE)) {
        out << ", rcode: " << std::dec << ((packet[1]&0x0000f0000)>>12);
    }
    else if ((tcode == QWRITE) || (tcode == QREAD) || (tcode == BWRITE) || (tcode == BREAD)) {
        out << ", dest_off: " << std::hex << (packet[1]&0x0000ffff) << std::endl;
        out << "  dest_off: " << packet[2] << std::dec;
    }
    out << std::endl;

    if ((tcode == BWRITE) || (tcode == BRESPONSE) || (tcode == BREAD)) {
        data_length = (packet[3]&0xffff0000) >> 16;
        out << "  data_length: " << std::dec << data_length
            << ", ext_tcode: " << std::hex << (packet[3]&0x0000ffff) << std::dec << std::endl;
        if (data_length%4 != 0)
            out << "WARNING: data_length is not a multiple of 4" << std::endl;
    }
    else if ((tcode == QWRITE) || (tcode == QRESPONSE)) {
        out << "  data: " << std::hex << packet[3] << std::dec << std::endl;
    }

    if (tcode == QREAD)
        out << "  header_crc: " << std::hex << packet[3] << std::dec << std::endl;
    else if (max_quads < 5)  // Nothing else to do for short packets
        return;
    else
        out << "  header_crc: " << std::hex << packet[4] << std::dec << std::endl;

    if ((tcode == BWRITE) || (tcode == BRESPONSE)) {
        data_length /= sizeof(quadlet_t);   // data_length in quadlets
        unsigned int lim = (data_length <= max_quads-5) ? data_length : max_quads-5;
        for (unsigned int i = 0; i < lim; i += 4) {
            out << "  data[" << std::dec << std::setfill(' ') << std::setw(3) << i << ":"
                << std::setw(3) << (i+3) << "]:  ";
            for (unsigned int j = 0; (j < 4) && ((i+j) < lim); j++)
                out << std::hex << std::setw(8) << std::setfill('0') << packet[5+i+j] << std::dec << "  ";
            out << std::endl;
        }
        if ((data_length > 0) && (data_length < max_quads-5))
            out << "  data_crc: " << std::hex << packet[5+data_length] << std::dec << std::endl;
    }
}